

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O0

void __thiscall FragmentTest_Empty_Test::~FragmentTest_Empty_Test(FragmentTest_Empty_Test *this)

{
  FragmentTest_Empty_Test *this_local;
  
  ~FragmentTest_Empty_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F (FragmentTest, Empty) {
    std::vector<std::unique_ptr<section_creation_dispatcher>> c;
    auto extent = fragment::alloc (transaction_, pstore::make_pointee_adaptor (std::begin (c)),
                                   pstore::make_pointee_adaptor (std::end (c)));

    auto f = reinterpret_cast<fragment const *> (extent.addr.absolute ());
    PSTORE_ASSERT (transaction_.get_storage ().begin ()->first ==
                   reinterpret_cast<std::uint8_t const *> (f));
    EXPECT_EQ (0U, f->size ());
}